

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QRenderRule * __thiscall
QStyleSheetStyle::renderRule
          (QRenderRule *__return_storage_ptr__,QStyleSheetStyle *this,QObject *obj,QStyleOption *opt
          ,int pseudoElement)

{
  ColorGroup CVar1;
  QFlagsStorage<QStyle::StateFlag> QVar2;
  bool bVar3;
  int iVar4;
  QPlainTextEdit *this_00;
  QTextEdit *this_01;
  QLineEdit *this_02;
  QFrame *this_03;
  quint64 qVar5;
  ulong uVar6;
  QFlagsStorage<QStyle::StateFlag> state;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  if (opt == (QStyleOption *)0x0) {
    state.i = 0;
switchD_00352549_caseD_6:
    this_00 = (QPlainTextEdit *)QMetaObject::cast((QObject *)&QPlainTextEdit::staticMetaObject);
    if (this_00 == (QPlainTextEdit *)0x0) {
      this_01 = (QTextEdit *)QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
      if (this_01 == (QTextEdit *)0x0) {
switchD_003526e9_default:
        uVar9 = 0;
        goto switchD_00352866_default;
      }
      bVar3 = QTextEdit::isReadOnly(this_01);
    }
    else {
      bVar3 = QPlainTextEdit::isReadOnly(this_00);
    }
    uVar9 = 0x8000000000;
    if (bVar3 != false) {
      uVar9 = 0x40000000;
    }
    goto switchD_00352866_default;
  }
  state.i = (opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
  if (opt->version < 1) goto switchD_00352549_caseD_6;
  iVar4 = opt->type;
  if (0xeffff < iVar4) {
    if (pseudoElement == 0) {
      if (iVar4 == 0xf0004) goto LAB_00352723;
      goto LAB_00352755;
    }
    QVar2.i = state.i & 0x181;
    if ((knownPseudoElements[pseudoElement].subControl & opt[1].type) != SC_None) {
      QVar2.i = state.i;
    }
    switch(pseudoElement) {
    case 8:
    case 9:
      uVar7 = state.i & 0x2000020;
      goto LAB_00352713;
    case 10:
    case 0x10:
      break;
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      if (iVar4 != 0xf0002) break;
      uVar7 = 0x20;
      if ((opt[1].direction & LayoutDirectionAuto) == LeftToRight) {
        uVar7 = 8;
      }
      if (pseudoElement - 0xbU < 2) {
        uVar7 = 8;
      }
      uVar8 = 0x20;
      if ((opt[1].direction & RightToLeft) == LeftToRight) {
        uVar8 = uVar7;
      }
      if (1 < pseudoElement - 0xbU) {
        uVar8 = uVar7;
      }
      state.i = uVar8 | QVar2.i;
      goto LAB_0035276a;
    case 0xf:
      uVar7 = state.i & 0x2004;
LAB_00352713:
      QVar2.i = QVar2.i | uVar7;
      break;
    case 0x11:
    case 0x12:
    case 0x13:
      uVar7 = state.i & 0x2000 | QVar2.i;
      QVar2.i = uVar7 | 4;
      if ((opt[1].type & SC_ComboBoxEditField) == SC_None && (state.i & 4) == 0) {
        QVar2.i = uVar7;
      }
      break;
    default:
      if (pseudoElement == 0x31) {
        uVar7 = state.i & 0x2000;
        goto LAB_00352713;
      }
    }
    state.i = QVar2.i;
    if (iVar4 == 0xf0004) {
      QVar2.i = state.i;
      if (pseudoElement == 0) {
LAB_00352723:
        QVar2.i = state.i | 4;
        if ((state.i >> 0xd & 1) != 0) {
          QVar2.i = state.i;
        }
        if ((opt[1].type & 2) == 0) {
          QVar2.i = state.i;
        }
      }
      state.i = QVar2.i;
      uVar9 = (ulong)(((byte)opt[1].rect.y2.m_i ^ 1) << 0x1d);
      if ((char)opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                super_QFlagsStorage<QStyle::StateFlag>.i == '\0') {
        uVar9 = uVar9 | 0x40000000;
      }
      else {
        uVar9 = uVar9 | 0x8000000000;
      }
    }
    else {
LAB_00352755:
      if (iVar4 == 0xf0006) {
        uVar6 = (ulong)((opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                         super_QFlagsStorage<QStyle::StateFlag>.i & 1) << 0x16);
        uVar9 = uVar6 + 0x20000000;
        if (*(int *)((long)&opt[1].styleObject + 4) != 0) {
          uVar9 = uVar6;
        }
      }
      else if (iVar4 == 0xf0005) {
        uVar7 = *(uint *)&opt[1].palette.d;
        if ((uVar7 & 1) == 0) {
          uVar9 = (ulong)(uVar7 & 2) << 0x23;
        }
        else {
          uVar9 = 0x800000000;
        }
      }
      else if (iVar4 == 0xf0002) {
LAB_0035276a:
        uVar9 = (ulong)(((byte)opt[1].rect.x1.m_i ^ 1) << 0x1d);
      }
      else {
        uVar9 = 0;
      }
    }
    goto LAB_00352501;
  }
  switch(iVar4) {
  case 2:
    uVar7 = (opt[1].version & 1U) << 0x16;
    uVar8 = (opt[1].version & 4U) << 0xd;
    goto LAB_0035268d;
  case 3:
    uVar9 = (ulong)*(uint *)((long)&opt[1].palette.d + 4);
    if (uVar9 < 4) {
      uVar9 = *(ulong *)(&DAT_00671b88 + uVar9 * 8);
    }
    else {
      uVar9 = 0;
    }
    CVar1 = opt[1].palette.currentGroup;
    if (CVar1 == Inactive) {
      uVar9 = uVar9 | 0x100000;
    }
    else if (CVar1 == Disabled) {
      uVar9 = uVar9 | 0x200000;
    }
    switch(opt[1].version) {
    case 0:
    case 4:
      uVar9 = uVar9 | 0x2000000;
      break;
    case 1:
    case 5:
      uVar9 = uVar9 | 0x4000000;
      break;
    case 2:
    case 6:
      uVar9 = uVar9 | 0x800000;
      break;
    case 3:
    case 7:
      uVar9 = uVar9 | 0x1000000;
    }
    break;
  case 4:
    iVar4 = opt[1].type;
    uVar9 = (ulong)(opt[1].version == 1) << 0xf;
    if (iVar4 != 0) {
      if (iVar4 == 2) {
        uVar9 = uVar9 | 0x10000000;
      }
      else if (iVar4 == 1) {
        uVar9 = uVar9 | 0x8000000;
      }
      uVar6 = 0x4000000040;
      if ((char)opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                super_QFlagsStorage<QStyle::StateFlag>.i != '\0') {
        uVar6 = 0x2000000020;
      }
      uVar9 = uVar9 | uVar6;
    }
    break;
  case 5:
    uVar7 = (uint)(opt[1].version == 0) << 0x1d;
    uVar8 = (opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i & 1) << 0x16;
LAB_0035268d:
    uVar9 = (ulong)(uVar8 | uVar7);
    break;
  default:
    goto switchD_00352549_caseD_6;
  case 7:
    if ((ulong)*(uint *)&opt[1].fontMetrics < 4) {
      uVar9 = *(ulong *)(&DAT_00671b88 + (ulong)*(uint *)&opt[1].fontMetrics * 8);
    }
    else {
      uVar9 = 0;
    }
    if (*(int *)&opt[1].field_0x24 == 2) {
LAB_0035283c:
      uVar9 = uVar9 | 0x100000;
    }
    else if (*(int *)&opt[1].field_0x24 == 1) goto LAB_00352830;
    break;
  case 8:
    uVar9 = (ulong)*(uint *)&opt[1].palette.field_0xc;
    if (uVar9 < 4) {
      uVar9 = *(ulong *)(&DAT_00671b88 + uVar9 * 8);
    }
    else {
      uVar9 = 0;
    }
    iVar4 = *(int *)&opt[1].styleObject;
    if (iVar4 == 1) {
LAB_00352830:
      uVar9 = uVar9 | 0x200000;
    }
    else {
      if (iVar4 == 2) goto LAB_0035283c;
      if (iVar4 == 3) {
        uVar9 = uVar9 | 0x300000;
      }
    }
    break;
  case 9:
    uVar9 = ((ulong)*(byte *)((long)&opt[1].rect.x2.m_i + 1) << 0x21) +
            ((ulong)*(byte *)((long)&opt[1].rect.x2.m_i + 2) << 0x22 |
            (ulong)(byte)opt[1].rect.x2.m_i << 0x20 |
            (ulong)*(byte *)((long)&opt[1].rect.x2.m_i + 3) << 10) + 0x400;
    break;
  case 10:
    uVar9 = (ulong)(*(uint *)((long)&opt[1].palette.d + 4) & 2) << 0x2b;
    switch(opt[3].version) {
    case 1:
switchD_00352866_caseD_0:
      uVar9 = uVar9 | 0x10000;
      break;
    case 2:
switchD_00352866_caseD_1:
      uVar9 = uVar9 | 0x40000;
      break;
    case 3:
switchD_00352866_caseD_2:
      uVar9 = uVar9 | 0x20000;
      break;
    case 4:
switchD_00352866_caseD_3:
      uVar9 = uVar9 | 0x80000;
    }
    break;
  case 0xb:
    switch(opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i) {
    case 0:
    case 4:
      uVar9 = 0x2000000;
      break;
    case 1:
    case 5:
      uVar9 = 0x4000000;
      break;
    case 2:
    case 6:
      uVar9 = 0x800000;
      break;
    case 3:
    case 7:
      uVar9 = 0x1000000;
      break;
    default:
      goto switchD_003526e9_default;
    }
    break;
  case 0xe:
    uVar7 = opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i - 1;
    if (uVar7 < 8) {
      uVar9 = *(ulong *)(&DAT_00670fb8 + (ulong)uVar7 * 8);
    }
    else {
      uVar9 = 0;
    }
    switch(opt[1].type) {
    case 0:
      goto switchD_00352866_caseD_0;
    case 1:
      goto switchD_00352866_caseD_1;
    case 2:
      goto switchD_00352866_caseD_2;
    case 3:
      goto switchD_00352866_caseD_3;
    }
  }
switchD_00352866_default:
  this_02 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
  if (this_02 == (QLineEdit *)0x0) {
    this_03 = (QFrame *)QMetaObject::cast((QObject *)&QFrame::staticMetaObject);
    if (this_03 != (QFrame *)0x0) {
      iVar4 = QFrame::lineWidth(this_03);
      if (iVar4 == 0) {
        uVar9 = uVar9 | 0x20000000;
      }
    }
  }
  else {
    state.i = state.i & 0xfffffffb;
    bVar3 = QLineEdit::hasFrame(this_02);
    if (bVar3) {
      uVar9 = uVar9 & 0xffffffffdfffffff;
    }
    else {
      uVar9 = uVar9 | 0x20000000;
    }
  }
LAB_00352501:
  qVar5 = pseudoClass((State)state.i);
  renderRule(__return_storage_ptr__,this,obj,pseudoElement,uVar9 | qVar5);
  return __return_storage_ptr__;
}

Assistant:

QRenderRule QStyleSheetStyle::renderRule(const QObject *obj, const QStyleOption *opt, int pseudoElement) const
{
    quint64 extraClass = 0;
    QStyle::State state = opt ? opt->state : QStyle::State(QStyle::State_None);

    if (const QStyleOptionComplex *complex = qstyleoption_cast<const QStyleOptionComplex *>(opt)) {
        if (pseudoElement != PseudoElement_None) {
            // if not an active subcontrol, just pass enabled/disabled
            QStyle::SubControl subControl = knownPseudoElements[pseudoElement].subControl;

            if (!(complex->activeSubControls & subControl))
                state &= (QStyle::State_Enabled | QStyle::State_Horizontal | QStyle::State_HasFocus);
        }

        switch (pseudoElement) {
        case PseudoElement_ComboBoxDropDown:
        case PseudoElement_ComboBoxArrow:
            state |= (complex->state & (QStyle::State_On|QStyle::State_ReadOnly));
            break;
        case PseudoElement_SpinBoxUpButton:
        case PseudoElement_SpinBoxDownButton:
        case PseudoElement_SpinBoxUpArrow:
        case PseudoElement_SpinBoxDownArrow:
#if QT_CONFIG(spinbox)
            if (const QStyleOptionSpinBox *sb = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
                bool on = false;
                bool up = pseudoElement == PseudoElement_SpinBoxUpButton
                          || pseudoElement == PseudoElement_SpinBoxUpArrow;
                if ((sb->stepEnabled & QAbstractSpinBox::StepUpEnabled) && up)
                    on = true;
                else if ((sb->stepEnabled & QAbstractSpinBox::StepDownEnabled) && !up)
                    on = true;
                state |= (on ? QStyle::State_On : QStyle::State_Off);
            }
#endif // QT_CONFIG(spinbox)
            break;
        case PseudoElement_GroupBoxTitle:
            state |= (complex->state & (QStyle::State_MouseOver | QStyle::State_Sunken));
            break;
        case PseudoElement_ToolButtonMenu:
        case PseudoElement_ToolButtonMenuArrow:
        case PseudoElement_ToolButtonMenuIndicator:
            state |= complex->state & QStyle::State_MouseOver;
            if (complex->state & QStyle::State_Sunken ||
                complex->activeSubControls & QStyle::SC_ToolButtonMenu)
                state |= QStyle::State_Sunken;
            break;
        case PseudoElement_SliderGroove:
            state |= complex->state & QStyle::State_MouseOver;
            break;
        default:
            break;
        }

        if (const QStyleOptionComboBox *combo = qstyleoption_cast<const QStyleOptionComboBox *>(opt)) {
            // QStyle::State_On is set when the popup is being shown
            // Propagate EditField Pressed state
            if (pseudoElement == PseudoElement_None
                && (complex->activeSubControls & QStyle::SC_ComboBoxEditField)
                && (!(state & QStyle::State_MouseOver))) {
                state |= QStyle::State_Sunken;
            }

            if (!combo->frame)
                extraClass |= PseudoClass_Frameless;
            if (!combo->editable)
                extraClass |= PseudoClass_ReadOnly;
            else
                extraClass |= PseudoClass_Editable;
#if QT_CONFIG(spinbox)
        } else if (const QStyleOptionSpinBox *spin = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            if (!spin->frame)
                extraClass |= PseudoClass_Frameless;
#endif // QT_CONFIG(spinbox)
        } else if (const QStyleOptionGroupBox *gb = qstyleoption_cast<const QStyleOptionGroupBox *>(opt)) {
            if (gb->features & QStyleOptionFrame::Flat)
                extraClass |= PseudoClass_Flat;
            if (gb->lineWidth == 0)
                extraClass |= PseudoClass_Frameless;
        } else if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            if (tb->titleBarState & Qt::WindowMinimized) {
                extraClass |= PseudoClass_Minimized;
            }
            else if (tb->titleBarState & Qt::WindowMaximized)
                extraClass |= PseudoClass_Maximized;
        }
    } else {
        // handle simple style options
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            if (mi->menuItemType == QStyleOptionMenuItem::DefaultItem)
                extraClass |= PseudoClass_Default;
            if (mi->checkType == QStyleOptionMenuItem::Exclusive)
                extraClass |= PseudoClass_Exclusive;
            else if (mi->checkType == QStyleOptionMenuItem::NonExclusive)
                extraClass |= PseudoClass_NonExclusive;
            if (mi->checkType != QStyleOptionMenuItem::NotCheckable)
                extraClass |= (mi->checked) ? (PseudoClass_On|PseudoClass_Checked)
                                            : (PseudoClass_Off|PseudoClass_Unchecked);
        } else if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
            if (hdr->position == QStyleOptionHeader::OnlyOneSection)
                extraClass |= PseudoClass_OnlyOne;
            else if (hdr->position == QStyleOptionHeader::Beginning)
                extraClass |= PseudoClass_First;
            else if (hdr->position == QStyleOptionHeader::End)
                extraClass |= PseudoClass_Last;
            else if (hdr->position == QStyleOptionHeader::Middle)
                extraClass |= PseudoClass_Middle;

            if (hdr->selectedPosition == QStyleOptionHeader::NextAndPreviousAreSelected)
                extraClass |= (PseudoClass_NextSelected | PseudoClass_PreviousSelected);
            else if (hdr->selectedPosition == QStyleOptionHeader::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (hdr->selectedPosition == QStyleOptionHeader::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;
#if QT_CONFIG(tabwidget)
        } else if (const QStyleOptionTabWidgetFrame *tab = qstyleoption_cast<const QStyleOptionTabWidgetFrame *>(opt)) {
            switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    extraClass |= PseudoClass_Top;
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    extraClass |= PseudoClass_Bottom;
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    extraClass |= PseudoClass_Right;
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    extraClass |= PseudoClass_Left;
                    break;
                default:
                    break;
            }
#endif
#if QT_CONFIG(tabbar)
        } else if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
            if (tab->position == QStyleOptionTab::OnlyOneTab)
                extraClass |= PseudoClass_OnlyOne;
            else if (tab->position == QStyleOptionTab::Beginning)
                extraClass |= PseudoClass_First;
            else if (tab->position == QStyleOptionTab::End)
                extraClass |= PseudoClass_Last;
            else if (tab->position == QStyleOptionTab::Middle)
                extraClass |= PseudoClass_Middle;

            if (tab->selectedPosition == QStyleOptionTab::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (tab->selectedPosition == QStyleOptionTab::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;

            switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    extraClass |= PseudoClass_Top;
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    extraClass |= PseudoClass_Bottom;
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    extraClass |= PseudoClass_Right;
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    extraClass |= PseudoClass_Left;
                    break;
                default:
                    break;
            }
#endif // QT_CONFIG(tabbar)
        } else if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (btn->features & QStyleOptionButton::Flat)
                extraClass |= PseudoClass_Flat;
            if (btn->features & QStyleOptionButton::DefaultButton)
                extraClass |= PseudoClass_Default;
        } else if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (frm->lineWidth == 0)
                extraClass |= PseudoClass_Frameless;
            if (frm->features & QStyleOptionFrame::Flat)
                extraClass |= PseudoClass_Flat;
        }
#if QT_CONFIG(toolbar)
        else if (const QStyleOptionToolBar *tb = qstyleoption_cast<const QStyleOptionToolBar *>(opt)) {
            if (tb->toolBarArea == Qt::LeftToolBarArea)
                extraClass |= PseudoClass_Left;
            else if (tb->toolBarArea == Qt::RightToolBarArea)
                extraClass |= PseudoClass_Right;
            else if (tb->toolBarArea == Qt::TopToolBarArea)
                extraClass |= PseudoClass_Top;
            else if (tb->toolBarArea == Qt::BottomToolBarArea)
                extraClass |= PseudoClass_Bottom;

            if (tb->positionWithinLine == QStyleOptionToolBar::Beginning)
                extraClass |= PseudoClass_First;
            else if (tb->positionWithinLine == QStyleOptionToolBar::Middle)
                extraClass |= PseudoClass_Middle;
            else if (tb->positionWithinLine == QStyleOptionToolBar::End)
                extraClass |= PseudoClass_Last;
            else if (tb->positionWithinLine == QStyleOptionToolBar::OnlyOne)
                extraClass |= PseudoClass_OnlyOne;
        }
#endif // QT_CONFIG(toolbar)
#if QT_CONFIG(toolbox)
        else if (const QStyleOptionToolBox *tb = qstyleoption_cast<const QStyleOptionToolBox *>(opt)) {
            if (tb->position == QStyleOptionToolBox::OnlyOneTab)
                extraClass |= PseudoClass_OnlyOne;
            else if (tb->position == QStyleOptionToolBox::Beginning)
                extraClass |= PseudoClass_First;
            else if (tb->position == QStyleOptionToolBox::End)
                extraClass |= PseudoClass_Last;
            else if (tb->position == QStyleOptionToolBox::Middle)
                extraClass |= PseudoClass_Middle;

            if (tb->selectedPosition == QStyleOptionToolBox::NextIsSelected)
                extraClass |= PseudoClass_NextSelected;
            else if (tb->selectedPosition == QStyleOptionToolBox::PreviousIsSelected)
                extraClass |= PseudoClass_PreviousSelected;
        }
#endif // QT_CONFIG(toolbox)
#if QT_CONFIG(dockwidget)
        else if (const QStyleOptionDockWidget *dw = qstyleoption_cast<const QStyleOptionDockWidget *>(opt)) {
            if (dw->verticalTitleBar)
                extraClass |= PseudoClass_Vertical;
            else
                extraClass |= PseudoClass_Horizontal;
            if (dw->closable)
                extraClass |= PseudoClass_Closable;
            if (dw->floatable)
                extraClass |= PseudoClass_Floatable;
            if (dw->movable)
                extraClass |= PseudoClass_Movable;
        }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(itemviews)
        else if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            if (vopt->features & QStyleOptionViewItem::Alternate)
                extraClass |= PseudoClass_Alternate;
            if (vopt->viewItemPosition == QStyleOptionViewItem::OnlyOne)
                extraClass |= PseudoClass_OnlyOne;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::Beginning)
                extraClass |= PseudoClass_First;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::End)
                extraClass |= PseudoClass_Last;
            else if (vopt->viewItemPosition == QStyleOptionViewItem::Middle)
                extraClass |= PseudoClass_Middle;

        }
#endif
#if QT_CONFIG(textedit)
        else if (const QPlainTextEdit *edit = qobject_cast<const QPlainTextEdit *>(obj)) {
            extraClass |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
        }
        else if (const QTextEdit *edit = qobject_cast<const QTextEdit *>(obj)) {
            extraClass |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
        }
#endif
#if QT_CONFIG(lineedit)
        // LineEdit sets Sunken flag to indicate Sunken frame (argh)
        if (const QLineEdit *lineEdit = qobject_cast<const QLineEdit *>(obj)) {
            state &= ~QStyle::State_Sunken;
            if (lineEdit->hasFrame()) {
                extraClass &= ~PseudoClass_Frameless;
            } else {
                extraClass |= PseudoClass_Frameless;
            }
        } else
#endif
        if (const QFrame *frm = qobject_cast<const QFrame *>(obj)) {
            if (frm->lineWidth() == 0)
                extraClass |= PseudoClass_Frameless;
        }
    }

    return renderRule(obj, pseudoElement, pseudoClass(state) | extraClass);
}